

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::GetAIXExports
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *param_1)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  cmValue cVar2;
  string_view value;
  allocator<char> local_31;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = cmTarget::IsAIX(this->GeneratorTarget->Target);
  if (bVar1) {
    this_00 = this->GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"AIX_EXPORT_ALL_SYMBOLS",&local_31);
    cVar2 = cmGeneratorTarget::GetProperty(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (cVar2.Value != (string *)0x0) {
      value._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
      value._M_len = (cVar2.Value)->_M_string_length;
      bVar1 = cmValue::IsOff(value);
      if (bVar1) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetAIXExports(std::string const&)
{
  std::string aixExports;
  if (this->GeneratorTarget->Target->IsAIX()) {
    if (cmValue exportAll =
          this->GeneratorTarget->GetProperty("AIX_EXPORT_ALL_SYMBOLS")) {
      if (cmIsOff(*exportAll)) {
        aixExports = "-n";
      }
    }
  }
  return aixExports;
}